

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunLatePeepholeOptimizations(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  VmValue *pVVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  VmInstructionType VVar7;
  uint uVar8;
  VmValue **ppVVar9;
  VmConstant *pVVar10;
  undefined1 uVar11;
  VmValue *pVVar12;
  VmInstruction *load;
  undefined8 uVar13;
  VmInstruction *pVVar14;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmValue *local_40;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar8 = value->typeID;
  if (uVar8 != 2) {
    if (uVar8 == 3) {
      pVVar12 = (VmValue *)value[1].comment.end;
      while (pVVar12 != (VmValue *)0x0) {
        pVVar3 = pVVar12[1].users.little[0];
        RunLatePeepholeOptimizations(ctx,module,pVVar12);
        pVVar12 = pVVar3;
      }
      return;
    }
    if (uVar8 != 4) {
      return;
    }
    pVVar12 = (VmValue *)value[1].source;
    while (pVVar12 != (VmValue *)0x0) {
      pVVar3 = (VmValue *)pVVar12[1].comment.begin;
      RunLatePeepholeOptimizations(ctx,module,pVVar12);
      pVVar12 = pVVar3;
    }
    return;
  }
  uVar8 = *(uint *)&value[1]._vptr_VmValue;
  uVar11 = (undefined1)(uVar8 - 0x26);
  if (uVar8 - 0x26 < 0xd) {
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1)
    ;
    pVVar14 = (VmInstruction *)*ppVVar9;
    if ((pVVar14 != (VmInstruction *)0x0) && ((pVVar14->super_VmValue).typeID == 2)) {
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                          ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
      uVar13._0_4_ = ((*ppVVar9)->type).type;
      uVar13._4_4_ = ((*ppVVar9)->type).size;
      load = (VmInstruction *)0x0;
LAB_001a504f:
      type.structType = (TypeBase *)pVVar14;
      type.type = (int)uVar13;
      type.size = (int)((ulong)uVar13 >> 0x20);
      bVar6 = anon_unknown.dwarf_11cad6::IsOperationNaturalLoad(type,load,(bool)uVar11);
      if ((((bVar6) && ((pVVar14->super_VmValue).users.count == 1)) &&
          (value[1].type.type == VM_TYPE_DOUBLE)) &&
         (bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14), bVar6)) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,0);
        pVVar12 = *ppVVar9;
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,1);
        pVVar3 = *ppVVar9;
        pVVar10 = CreateConstantInt(ctx->allocator,value->source,pVVar14->cmd);
        VVar7 = anon_unknown.dwarf_11cad6::GetOperationWithLoad
                          (*(VmInstructionType *)&value[1]._vptr_VmValue);
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                            ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
        anon_unknown.dwarf_11cad6::ChangeInstructionTo
                  (module,(VmInstruction *)value,VVar7,*ppVVar9,pVVar12,pVVar3,
                   &pVVar10->super_VmValue,(VmValue *)0x0,&module->peepholeOptimizations);
      }
    }
  }
  else {
    uVar11 = (undefined1)(uVar8 - 0x22);
    if (3 < uVar8 - 0x22) goto LAB_001a511b;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1)
    ;
    pVVar14 = (VmInstruction *)*ppVVar9;
    if ((pVVar14 != (VmInstruction *)0x0) && ((pVVar14->super_VmValue).typeID == 2)) {
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                          ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
      uVar13._0_4_ = ((*ppVVar9)->type).type;
      uVar13._4_4_ = ((*ppVVar9)->type).size;
      load = (VmInstruction *)0x1;
      goto LAB_001a504f;
    }
  }
  uVar8 = *(uint *)&value[1]._vptr_VmValue;
LAB_001a511b:
  if (0x32 < uVar8) {
    return;
  }
  uVar11 = 0;
  if ((0x7301400000000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
    uVar11 = 0;
    if ((0xf0000000000U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
      return;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0)
    ;
    pVVar14 = (VmInstruction *)*ppVVar9;
    if (pVVar14 == (VmInstruction *)0x0) {
      return;
    }
    if ((pVVar14->super_VmValue).typeID != 2) {
      return;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1)
    ;
    uVar2 = ((*ppVVar9)->type).type;
    uVar5 = ((*ppVVar9)->type).size;
    type_01.size = uVar5;
    type_01.type = uVar2;
    type_01.structType = (TypeBase *)pVVar14;
    bVar6 = anon_unknown.dwarf_11cad6::IsOperationNaturalLoad
                      (type_01,(VmInstruction *)0x0,(bool)uVar11);
    if (!bVar6) {
      return;
    }
    if ((pVVar14->super_VmValue).users.count != 1) {
      return;
    }
    if (value[1].type.type != VM_TYPE_DOUBLE) {
      return;
    }
    bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14);
    if (!bVar6) {
      return;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,0);
    local_40 = *ppVVar9;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,1);
    pVVar12 = *ppVVar9;
    pVVar10 = CreateConstantInt(ctx->allocator,value->source,pVVar14->cmd);
    uVar8 = *(int *)&value[1]._vptr_VmValue - 0x28;
    if (3 < uVar8) {
      __assert_fail("!\"unknown operation\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x121,
                    "VmInstructionType (anonymous namespace)::GetMirroredComparisonOperationWithLoad(VmInstructionType)"
                   );
    }
    VVar7 = *(VmInstructionType *)(&DAT_001f2690 + (ulong)uVar8 * 4);
  }
  else {
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0)
    ;
    pVVar14 = (VmInstruction *)*ppVVar9;
    if (pVVar14 == (VmInstruction *)0x0) {
      return;
    }
    if ((pVVar14->super_VmValue).typeID != 2) {
      return;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1)
    ;
    uVar1 = ((*ppVVar9)->type).type;
    uVar4 = ((*ppVVar9)->type).size;
    type_00.size = uVar4;
    type_00.type = uVar1;
    type_00.structType = (TypeBase *)pVVar14;
    bVar6 = anon_unknown.dwarf_11cad6::IsOperationNaturalLoad
                      (type_00,(VmInstruction *)0x0,(bool)uVar11);
    if (!bVar6) {
      return;
    }
    if ((pVVar14->super_VmValue).users.count != 1) {
      return;
    }
    if (value[1].type.type != VM_TYPE_DOUBLE) {
      return;
    }
    bVar6 = IsReachableLoadValue((VmInstruction *)value,pVVar14);
    if (!bVar6) {
      return;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,0);
    local_40 = *ppVVar9;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar14->arguments,1);
    pVVar12 = *ppVVar9;
    pVVar10 = CreateConstantInt(ctx->allocator,value->source,pVVar14->cmd);
    VVar7 = anon_unknown.dwarf_11cad6::GetOperationWithLoad
                      (*(VmInstructionType *)&value[1]._vptr_VmValue);
  }
  ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1);
  anon_unknown.dwarf_11cad6::ChangeInstructionTo
            (module,(VmInstruction *)value,VVar7,*ppVVar9,local_40,pVVar12,&pVVar10->super_VmValue,
             (VmValue *)0x0,&module->peepholeOptimizations);
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}